

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Int_t * Llb_Nonlin4CreateOrderSimple(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  iVar1 = pAig->vObjs->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar5->nCap = iVar7;
  uVar10 = 0;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  pVVar3 = pAig->vCis;
  if (0 < pVVar3->nSize) {
    ppvVar4 = pVVar3->pArray;
    uVar8 = 0;
    do {
      iVar7 = *(int *)((long)ppvVar4[uVar8] + 0x24);
      if (((long)iVar7 < 0) || (iVar1 <= iVar7)) goto LAB_007e5e6c;
      uVar10 = uVar8 + 1;
      __s[iVar7] = (int)uVar8;
      uVar8 = uVar10;
    } while ((long)uVar10 < (long)pVVar3->nSize);
  }
  lVar6 = (long)pAig->nRegs;
  if (0 < lVar6) {
    pVVar3 = pAig->vCos;
    iVar7 = pAig->nTruePos;
    lVar9 = (long)iVar7;
    do {
      if ((iVar7 < 0) || (pVVar3->nSize <= lVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar3->pArray[lVar9] + 0x24);
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_007e5e6c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar2] = (int)uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrderSimple( Aig_Man_t * pAig )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    return vOrder;
}